

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

AV1_COMP * av1_get_parallel_frame_enc_data(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  AV1_COMP *pAVar1;
  RefCntBuffer *pRVar2;
  int64_t iVar3;
  uint uVar4;
  int iVar5;
  ulong __n;
  long lVar6;
  
  uVar4 = 0;
  pAVar1 = ppi->cpi;
  if (1 < (long)ppi->num_fp_contexts) {
    lVar6 = 1;
    do {
      if (pAVar1->gf_frame_index == ppi->parallel_cpi[lVar6]->gf_frame_index) {
        uVar4 = (uint)lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
    } while (ppi->num_fp_contexts != lVar6);
  }
  pRVar2 = (pAVar1->common).cur_frame;
  if (pRVar2 != (RefCntBuffer *)0x0) {
    pRVar2->ref_count = pRVar2->ref_count + -1;
    (pAVar1->common).cur_frame = (RefCntBuffer *)0x0;
  }
  ppi->cpi = ppi->parallel_cpi[uVar4];
  ppi->parallel_cpi[uVar4] = ppi->parallel_cpi[0];
  ppi->parallel_cpi[0] = ppi->cpi;
  iVar5 = uVar4 - 1;
  __n = ppi->parallel_frames_data[iVar5].frame_size;
  if (first_cpi_data->cx_data_sz < __n) {
    aom_internal_error(&ppi->error,AOM_CODEC_ERROR,"first_cpi_data->cx_data buffer full");
    __n = ppi->parallel_frames_data[iVar5].frame_size;
  }
  first_cpi_data->lib_flags = ppi->parallel_frames_data[iVar5].lib_flags;
  iVar3 = ppi->parallel_frames_data[iVar5].ts_frame_end;
  first_cpi_data->ts_frame_start = ppi->parallel_frames_data[iVar5].ts_frame_start;
  first_cpi_data->ts_frame_end = iVar3;
  memcpy(first_cpi_data->cx_data,ppi->parallel_frames_data[iVar5].cx_data,__n);
  first_cpi_data->frame_size = ppi->parallel_frames_data[iVar5].frame_size;
  pAVar1 = ppi->cpi;
  if ((pAVar1->common).show_frame != 0) {
    first_cpi_data->pop_lookahead = 1;
  }
  return pAVar1;
}

Assistant:

AV1_COMP *av1_get_parallel_frame_enc_data(AV1_PRIMARY *const ppi,
                                          AV1_COMP_DATA *const first_cpi_data) {
  int cpi_idx = 0;

  // Loop over parallel_cpi to find the cpi that processed the current
  // gf_frame_index ahead of time.
  for (int i = 1; i < ppi->num_fp_contexts; i++) {
    if (ppi->cpi->gf_frame_index == ppi->parallel_cpi[i]->gf_frame_index) {
      cpi_idx = i;
      break;
    }
  }

  assert(cpi_idx > 0);
  assert(!ppi->parallel_cpi[cpi_idx]->common.show_existing_frame);

  // Release the previously-used frame-buffer.
  if (ppi->cpi->common.cur_frame != NULL) {
    --ppi->cpi->common.cur_frame->ref_count;
    ppi->cpi->common.cur_frame = NULL;
  }

  // Swap the appropriate parallel_cpi with the parallel_cpi[0].
  ppi->cpi = ppi->parallel_cpi[cpi_idx];
  ppi->parallel_cpi[cpi_idx] = ppi->parallel_cpi[0];
  ppi->parallel_cpi[0] = ppi->cpi;

  // Copy appropriate parallel_frames_data to local data.
  {
    AV1_COMP_DATA *data = &ppi->parallel_frames_data[cpi_idx - 1];
    assert(data->frame_size > 0);
    if (data->frame_size > first_cpi_data->cx_data_sz) {
      aom_internal_error(&ppi->error, AOM_CODEC_ERROR,
                         "first_cpi_data->cx_data buffer full");
    }

    first_cpi_data->lib_flags = data->lib_flags;
    first_cpi_data->ts_frame_start = data->ts_frame_start;
    first_cpi_data->ts_frame_end = data->ts_frame_end;
    memcpy(first_cpi_data->cx_data, data->cx_data, data->frame_size);
    first_cpi_data->frame_size = data->frame_size;
    if (ppi->cpi->common.show_frame) {
      first_cpi_data->pop_lookahead = 1;
    }
  }

  return ppi->cpi;
}